

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

RunElement __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
StartGames(MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          Games *losers,RunElements *elements,RunElement *sentinel)

{
  unsigned_long uVar1;
  long lVar2;
  pair<unsigned_long,_unsigned_long> *ppVar3;
  pair<unsigned_long,_unsigned_long> *ppVar4;
  pair<unsigned_long,_unsigned_long> *ppVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  pair<unsigned_long,_unsigned_long> *ppVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  idx_t i;
  long lVar14;
  Games winners;
  unsigned_long uStack_218;
  RunElement local_210;
  ulong auStack_200 [28];
  unsigned_long auStack_120 [32];
  
  lVar14 = 0;
  switchD_01306cb1::default(&local_210,0,0x1f0);
  lVar2 = 0xf8;
  ppVar3 = elements->_M_elems;
  do {
    ppVar4 = elements->_M_elems + lVar14 * 2 + 1;
    uVar7 = ((pair<unsigned_long,_unsigned_long> *)&ppVar3->first)->first;
    uVar12 = ppVar3[1].first;
    if ((uVar7 < uVar12) ||
       ((ppVar5 = ppVar4, ppVar9 = ppVar3, uVar7 <= uVar12 && (ppVar3->second < ppVar3[1].second))))
    {
      ppVar5 = ppVar3;
      uVar7 = uVar12;
      ppVar9 = ppVar4;
    }
    *(ulong *)((long)losers->_M_elems + lVar2 + -8) = uVar7;
    *(unsigned_long *)((long)&losers->_M_elems[0].first + lVar2) = ppVar9->second;
    uVar1 = ppVar5->second;
    *(unsigned_long *)((long)&uStack_218 + lVar2) =
         ((pair<unsigned_long,_unsigned_long> *)&ppVar5->first)->first;
    *(unsigned_long *)((long)&local_210.first + lVar2) = uVar1;
    lVar14 = lVar14 + 1;
    lVar2 = lVar2 + 0x10;
    ppVar3 = ppVar3 + 2;
  } while (lVar2 != 0x1f8);
  lVar2 = 0xe;
  lVar14 = 0x74;
  lVar6 = 0x1d0;
  do {
    puVar11 = (ulong *)((long)&local_210.first + lVar6);
    puVar13 = auStack_200 + lVar2 * 4 + 2;
    uVar7 = *puVar11;
    uVar12 = *(ulong *)((long)auStack_200 + lVar6);
    puVar8 = puVar11;
    uVar10 = uVar7;
    if ((uVar12 <= uVar7) &&
       ((uVar12 < uVar7 ||
        (*(ulong *)((long)auStack_200 + lVar6 + 8) <= *(ulong *)((long)&local_210.second + lVar6))))
       ) {
      puVar8 = puVar13;
      uVar10 = uVar12;
      uVar12 = uVar7;
      puVar13 = puVar11;
    }
    *(ulong *)((long)losers->_M_elems + lVar14 * 2 + -8) = uVar12;
    *(ulong *)((long)&losers->_M_elems[0].first + lVar14 * 2) = puVar13[1];
    *(ulong *)((long)&uStack_218 + lVar14 * 2) = uVar10;
    *(ulong *)((long)&local_210.first + lVar14 * 2) = puVar8[1];
    lVar2 = lVar2 + -1;
    lVar14 = lVar14 + -8;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x10);
  return local_210;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}